

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O0

iStack<Imaginer::Utils::iRpn::RPNnode> __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>::cut
          (iStack<Imaginer::Utils::iRpn::RPNnode> *this,int start,int end)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined4 in_register_00000034;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_00;
  iStack<Imaginer::Utils::iRpn::RPNnode> iVar3;
  int local_2c;
  int local_28;
  int i;
  int local_20;
  int local_1c;
  int end_local;
  int start_local;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_local;
  iStack<Imaginer::Utils::iRpn::RPNnode> *rt;
  
  this_00 = (iStack<Imaginer::Utils::iRpn::RPNnode> *)CONCAT44(in_register_00000034,start);
  i._3_1_ = 0;
  local_28 = 0x400;
  local_20 = in_ECX;
  local_1c = end;
  _end_local = this_00;
  this_local = this;
  iStack(this,&local_28);
  iVar1 = local_20;
  iVar2 = size(this_00);
  if (iVar2 < iVar1) {
    local_20 = size(this_00);
    local_20 = local_20 + 1;
  }
  local_2c = local_1c;
  while (local_2c < local_20) {
    push(this,this_00->_data + local_2c);
    local_2c = local_2c + 1;
  }
  this_00->_data = this_00->_data + local_2c;
  this_00->_top = this_00->_top - local_2c;
  iVar3._size = local_2c;
  iVar3._data = (RPNnode *)this;
  iVar3._top = 0;
  return iVar3;
}

Assistant:

iStack<Type>  cut(int start = 0,int end = 1024)
    {
        iStack<Type> rt;
        (end > size())?(end = size()+1):(end);
        int i = start;
        while(i < end)
        {
            rt.push(_data[i++]);
        }
        _data = _data+i;
        _top-=i;
        return rt;
    }